

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_transcoder.cpp
# Opt level: O0

bool __thiscall
basist::basisu_transcoder::start_transcoding(basisu_transcoder *this,void *pData,uint32_t data_size)

{
  bool bVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  basisu_lowlevel_etc1s_transcoder *pbVar5;
  endpoint_vec *peVar6;
  selector_vec *this_00;
  uint in_EDX;
  packed_uint<4U> *in_RSI;
  basisu_lowlevel_etc1s_transcoder *in_RDI;
  uint8_t *pDataU8;
  basis_file_header *pHeader;
  uint8_t *in_stack_00000208;
  uint32_t in_stack_00000210;
  uint32_t in_stack_00000214;
  uint8_t *in_stack_00000218;
  uint32_t in_stack_00000224;
  basisu_lowlevel_etc1s_transcoder *in_stack_00000228;
  uint32_t in_stack_00000240;
  basisu_lowlevel_etc1s_transcoder *in_stack_ffffffffffffff60;
  packed_uint<4U> *in_stack_ffffffffffffff70;
  undefined8 in_stack_ffffffffffffff78;
  packed_uint<4U> *ppVar7;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  basisu_transcoder *in_stack_ffffffffffffff88;
  uint32_t in_stack_ffffffffffffff90;
  uint32_t in_stack_ffffffffffffff94;
  basisu_lowlevel_etc1s_transcoder *in_stack_ffffffffffffff98;
  
  bVar1 = validate_header_quick
                    (in_stack_ffffffffffffff88,
                     (void *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                     (uint32_t)((ulong)in_stack_ffffffffffffff78 >> 0x20));
  uVar4 = (uint32_t)((ulong)in_stack_ffffffffffffff88 >> 0x20);
  if (!bVar1) {
    return false;
  }
  uVar2 = basisu::packed_uint::operator_cast_to_unsigned_int((packed_uint *)(in_RSI + 5));
  if (uVar2 == 0) {
    uVar2 = basisu::vector<basist::endpoint>::size(&in_RDI->m_local_endpoints);
    if (uVar2 != 0) {
      basisu_lowlevel_etc1s_transcoder::clear(in_stack_ffffffffffffff60);
    }
    uVar2 = basisu::packed_uint::operator_cast_to_unsigned_int
                      ((packed_uint *)(in_RSI[5].m_bytes + 1));
    if ((uVar2 & 8) == 0) {
      uVar4 = basisu::packed_uint::operator_cast_to_unsigned_int
                        ((packed_uint *)(in_RSI[0xb].m_bytes + 1));
      if (((uVar4 == 0) ||
          (uVar4 = basisu::packed_uint::operator_cast_to_unsigned_int
                             ((packed_uint *)(in_RSI[0xd].m_bytes + 2)), uVar4 == 0)) ||
         (uVar4 = basisu::packed_uint::operator_cast_to_unsigned_int(in_stack_ffffffffffffff70),
         uVar4 == 0)) {
        return false;
      }
      uVar4 = basisu::packed_uint::operator_cast_to_unsigned_int(in_stack_ffffffffffffff70);
      if (((in_EDX < uVar4) ||
          (uVar4 = basisu::packed_uint::operator_cast_to_unsigned_int(in_stack_ffffffffffffff70),
          in_EDX < uVar4)) ||
         (uVar4 = basisu::packed_uint::operator_cast_to_unsigned_int(in_stack_ffffffffffffff70),
         in_EDX < uVar4)) {
        return false;
      }
      uVar4 = basisu::packed_uint::operator_cast_to_unsigned_int
                        ((packed_uint *)(in_RSI[0xb].m_bytes + 1));
      uVar2 = basisu::packed_uint::operator_cast_to_unsigned_int(in_stack_ffffffffffffff70);
      if (in_EDX - uVar2 < uVar4) {
        return false;
      }
      uVar4 = basisu::packed_uint::operator_cast_to_unsigned_int
                        ((packed_uint *)(in_RSI[0xd].m_bytes + 2));
      uVar2 = basisu::packed_uint::operator_cast_to_unsigned_int(in_stack_ffffffffffffff70);
      if (in_EDX - uVar2 < uVar4) {
        return false;
      }
      uVar4 = basisu::packed_uint::operator_cast_to_unsigned_int(in_stack_ffffffffffffff70);
      uVar2 = basisu::packed_uint::operator_cast_to_unsigned_int(in_stack_ffffffffffffff70);
      if (in_EDX - uVar2 < uVar4) {
        return false;
      }
      basisu::packed_uint::operator_cast_to_unsigned_int((packed_uint *)(in_RSI[9].m_bytes + 3));
      in_stack_ffffffffffffff70 = in_RSI;
      uVar4 = basisu::packed_uint::operator_cast_to_unsigned_int(in_RSI);
      uVar4 = (uint32_t)((ulong)(in_stack_ffffffffffffff70->m_bytes + uVar4) >> 0x20);
      in_stack_ffffffffffffff90 =
           basisu::packed_uint::operator_cast_to_unsigned_int
                     ((packed_uint *)(in_RSI[0xb].m_bytes + 1));
      in_stack_ffffffffffffff94 =
           basisu::packed_uint::operator_cast_to_unsigned_int((packed_uint *)(in_RSI + 0xc));
      ppVar7 = in_RSI;
      uVar2 = basisu::packed_uint::operator_cast_to_unsigned_int(in_stack_ffffffffffffff70);
      in_stack_ffffffffffffff98 = (basisu_lowlevel_etc1s_transcoder *)(ppVar7->m_bytes + uVar2);
      basisu::packed_uint::operator_cast_to_unsigned_int((packed_uint *)(in_RSI[0xd].m_bytes + 2));
      bVar1 = basisu_lowlevel_etc1s_transcoder::decode_palettes
                        (in_stack_00000228,in_stack_00000224,in_stack_00000218,in_stack_00000214,
                         in_stack_00000210,in_stack_00000208,in_stack_00000240);
      if (!bVar1) {
        return false;
      }
    }
    else {
      pbVar5 = basisu_lowlevel_etc1s_transcoder::get_global_codebooks(in_RDI);
      if (pbVar5 == (basisu_lowlevel_etc1s_transcoder *)0x0) {
        return false;
      }
      pbVar5 = basisu_lowlevel_etc1s_transcoder::get_global_codebooks(in_RDI);
      peVar6 = basisu_lowlevel_etc1s_transcoder::get_endpoints(pbVar5);
      uVar2 = basisu::vector<basist::endpoint>::size(peVar6);
      if (uVar2 == 0) {
        return false;
      }
      pbVar5 = basisu_lowlevel_etc1s_transcoder::get_global_codebooks(in_RDI);
      peVar6 = basisu_lowlevel_etc1s_transcoder::get_endpoints(pbVar5);
      uVar2 = basisu::vector<basist::endpoint>::size(peVar6);
      uVar3 = basisu::packed_uint::operator_cast_to_unsigned_int
                        ((packed_uint *)(in_RSI[9].m_bytes + 3));
      if (uVar2 != uVar3) {
        return false;
      }
      pbVar5 = basisu_lowlevel_etc1s_transcoder::get_global_codebooks(in_RDI);
      this_00 = basisu_lowlevel_etc1s_transcoder::get_selectors(pbVar5);
      uVar2 = basisu::vector<basist::selector>::size(this_00);
      uVar3 = basisu::packed_uint::operator_cast_to_unsigned_int((packed_uint *)(in_RSI + 0xc));
      if (uVar2 != uVar3) {
        return false;
      }
      uVar2 = basisu::packed_uint::operator_cast_to_unsigned_int(in_stack_ffffffffffffff70);
      if (uVar2 == 0) {
        return false;
      }
      uVar2 = basisu::packed_uint::operator_cast_to_unsigned_int(in_stack_ffffffffffffff70);
      if (in_EDX < uVar2) {
        return false;
      }
      uVar2 = basisu::packed_uint::operator_cast_to_unsigned_int(in_stack_ffffffffffffff70);
      uVar3 = basisu::packed_uint::operator_cast_to_unsigned_int(in_stack_ffffffffffffff70);
      if (in_EDX - uVar3 < uVar2) {
        return false;
      }
    }
    basisu::packed_uint::operator_cast_to_unsigned_int(in_stack_ffffffffffffff70);
    basisu::packed_uint::operator_cast_to_unsigned_int(in_stack_ffffffffffffff70);
    bVar1 = basisu_lowlevel_etc1s_transcoder::decode_tables
                      (in_stack_ffffffffffffff98,
                       (uint8_t *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                       uVar4);
    if (!bVar1) {
      return false;
    }
  }
  else {
    uVar4 = basisu::vector<basist::endpoint>::size(&in_RDI->m_local_endpoints);
    if (uVar4 != 0) {
      basisu_lowlevel_etc1s_transcoder::clear(in_stack_ffffffffffffff60);
    }
  }
  *(undefined1 *)((long)&in_RDI[1].m_pGlobal_codebook + 1) = 1;
  return true;
}

Assistant:

bool basisu_transcoder::start_transcoding(const void* pData, uint32_t data_size)
	{
		if (!validate_header_quick(pData, data_size))
		{
			BASISU_DEVEL_ERROR("basisu_transcoder::start_transcoding: header validation failed\n");
			return false;
		}

		const basis_file_header* pHeader = reinterpret_cast<const basis_file_header*>(pData);
		const uint8_t* pDataU8 = static_cast<const uint8_t*>(pData);

		if (pHeader->m_tex_format == (int)basis_tex_format::cETC1S)
		{
			if (m_lowlevel_etc1s_decoder.m_local_endpoints.size())
			{
				m_lowlevel_etc1s_decoder.clear();
			}

			if (pHeader->m_flags & cBASISHeaderFlagUsesGlobalCodebook)
			{
				if (!m_lowlevel_etc1s_decoder.get_global_codebooks())
				{
					BASISU_DEVEL_ERROR("basisu_transcoder::start_transcoding: File uses global codebooks, but set_global_codebooks() has not been called\n");
					return false;
				}
				if (!m_lowlevel_etc1s_decoder.get_global_codebooks()->get_endpoints().size())
				{
					BASISU_DEVEL_ERROR("basisu_transcoder::start_transcoding: Global codebooks must be unpacked first by calling start_transcoding()\n");
					return false;
				}
				if ((m_lowlevel_etc1s_decoder.get_global_codebooks()->get_endpoints().size() != pHeader->m_total_endpoints) ||
					 (m_lowlevel_etc1s_decoder.get_global_codebooks()->get_selectors().size() != pHeader->m_total_selectors))
				{
					BASISU_DEVEL_ERROR("basisu_transcoder::start_transcoding: Global codebook size mismatch (wrong codebooks for file).\n");
					return false;
				}
				if (!pHeader->m_tables_file_size)
				{
					BASISU_DEVEL_ERROR("basisu_transcoder::start_transcoding: file is corrupted (2)\n");
					return false;
				}
				if (pHeader->m_tables_file_ofs > data_size)
				{
					BASISU_DEVEL_ERROR("basisu_transcoder::start_transcoding: file is corrupted or passed in buffer too small (4)\n");
					return false;
				}
				if (pHeader->m_tables_file_size > (data_size - pHeader->m_tables_file_ofs))
				{
					BASISU_DEVEL_ERROR("basisu_transcoder::start_transcoding: file is corrupted or passed in buffer too small (5)\n");
					return false;
				}
			}
			else
			{
				if (!pHeader->m_endpoint_cb_file_size || !pHeader->m_selector_cb_file_size || !pHeader->m_tables_file_size)
				{
					BASISU_DEVEL_ERROR("basisu_transcoder::start_transcoding: file is corrupted (0)\n");
						return false;
				}

				if ((pHeader->m_endpoint_cb_file_ofs > data_size) || (pHeader->m_selector_cb_file_ofs > data_size) || (pHeader->m_tables_file_ofs > data_size))
				{
					BASISU_DEVEL_ERROR("basisu_transcoder::start_transcoding: file is corrupted or passed in buffer too small (1)\n");
					return false;
				}

				if (pHeader->m_endpoint_cb_file_size > (data_size - pHeader->m_endpoint_cb_file_ofs))
				{
					BASISU_DEVEL_ERROR("basisu_transcoder::start_transcoding: file is corrupted or passed in buffer too small (2)\n");
					return false;
				}

				if (pHeader->m_selector_cb_file_size > (data_size - pHeader->m_selector_cb_file_ofs))
				{
					BASISU_DEVEL_ERROR("basisu_transcoder::start_transcoding: file is corrupted or passed in buffer too small (3)\n");
					return false;
				}

				if (pHeader->m_tables_file_size > (data_size - pHeader->m_tables_file_ofs))
				{
					BASISU_DEVEL_ERROR("basisu_transcoder::start_transcoding: file is corrupted or passed in buffer too small (3)\n");
					return false;
				}

				if (!m_lowlevel_etc1s_decoder.decode_palettes(
					pHeader->m_total_endpoints, pDataU8 + pHeader->m_endpoint_cb_file_ofs, pHeader->m_endpoint_cb_file_size,
					pHeader->m_total_selectors, pDataU8 + pHeader->m_selector_cb_file_ofs, pHeader->m_selector_cb_file_size))
				{
					BASISU_DEVEL_ERROR("basisu_transcoder::start_transcoding: decode_palettes failed\n");
					return false;
				}
			}

			if (!m_lowlevel_etc1s_decoder.decode_tables(pDataU8 + pHeader->m_tables_file_ofs, pHeader->m_tables_file_size))
			{
				BASISU_DEVEL_ERROR("basisu_transcoder::start_transcoding: decode_tables failed\n");
				return false;
			}
		}
		else
		{
			// Nothing special to do for UASTC.
			if (m_lowlevel_etc1s_decoder.m_local_endpoints.size())
			{
				m_lowlevel_etc1s_decoder.clear();
			}
		}
		
		m_ready_to_transcode = true;

		return true;
	}